

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3rbu_create_vfs(char *zName,char *zParent)

{
  int iVar1;
  size_t __n;
  sqlite3_vfs *pVfs;
  sqlite3_vfs *psVar2;
  sqlite3_mutex *psVar3;
  
  __n = strlen(zName);
  pVfs = (sqlite3_vfs *)sqlite3_malloc64(__n + 0xd1);
  if (pVfs == (sqlite3_vfs *)0x0) {
    iVar1 = 7;
  }
  else {
    memset(pVfs,0,__n + 0xd1);
    psVar2 = sqlite3_vfs_find(zParent);
    if (psVar2 == (sqlite3_vfs *)0x0) {
      iVar1 = 0xc;
    }
    else {
      memcpy(pVfs,&sqlite3rbu_create_vfs::vfs_template,0xa8);
      pVfs->mxPathname = psVar2->mxPathname;
      pVfs->szOsFile = psVar2->szOsFile + 0x68;
      *(sqlite3_vfs **)(pVfs + 1) = psVar2;
      pVfs->zName = (char *)&pVfs[1].xOpen;
      memcpy(&pVfs[1].xOpen,zName,__n);
      psVar3 = sqlite3_mutex_alloc(1);
      *(sqlite3_mutex **)&pVfs[1].mxPathname = psVar3;
      if (psVar3 == (sqlite3_mutex *)0x0) {
        iVar1 = 7;
      }
      else {
        iVar1 = sqlite3_vfs_register(pVfs,0);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
    if (*(sqlite3_mutex **)&pVfs[1].mxPathname != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexFree)(*(sqlite3_mutex **)&pVfs[1].mxPathname);
    }
    sqlite3_free(pVfs);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3rbu_create_vfs(const char *zName, const char *zParent){

  /* Template for VFS */
  static sqlite3_vfs vfs_template = {
    1,                            /* iVersion */
    0,                            /* szOsFile */
    0,                            /* mxPathname */
    0,                            /* pNext */
    0,                            /* zName */
    0,                            /* pAppData */
    rbuVfsOpen,                   /* xOpen */
    rbuVfsDelete,                 /* xDelete */
    rbuVfsAccess,                 /* xAccess */
    rbuVfsFullPathname,           /* xFullPathname */

#ifndef SQLITE_OMIT_LOAD_EXTENSION
    rbuVfsDlOpen,                 /* xDlOpen */
    rbuVfsDlError,                /* xDlError */
    rbuVfsDlSym,                  /* xDlSym */
    rbuVfsDlClose,                /* xDlClose */
#else
    0, 0, 0, 0,
#endif

    rbuVfsRandomness,             /* xRandomness */
    rbuVfsSleep,                  /* xSleep */
    rbuVfsCurrentTime,            /* xCurrentTime */
    rbuVfsGetLastError,           /* xGetLastError */
    0,                            /* xCurrentTimeInt64 (version 2) */
    0, 0, 0                       /* Unimplemented version 3 methods */
  };

  rbu_vfs *pNew = 0;              /* Newly allocated VFS */
  int rc = SQLITE_OK;
  size_t nName;
  size_t nByte;

  nName = strlen(zName);
  nByte = sizeof(rbu_vfs) + nName + 1;
  pNew = (rbu_vfs*)sqlite3_malloc64(nByte);
  if( pNew==0 ){
    rc = SQLITE_NOMEM;
  }else{
    sqlite3_vfs *pParent;           /* Parent VFS */
    memset(pNew, 0, nByte);
    pParent = sqlite3_vfs_find(zParent);
    if( pParent==0 ){
      rc = SQLITE_NOTFOUND;
    }else{
      char *zSpace;
      memcpy(&pNew->base, &vfs_template, sizeof(sqlite3_vfs));
      pNew->base.mxPathname = pParent->mxPathname;
      pNew->base.szOsFile = sizeof(rbu_file) + pParent->szOsFile;
      pNew->pRealVfs = pParent;
      pNew->base.zName = (const char*)(zSpace = (char*)&pNew[1]);
      memcpy(zSpace, zName, nName);

      /* Allocate the mutex and register the new VFS (not as the default) */
      pNew->mutex = sqlite3_mutex_alloc(SQLITE_MUTEX_RECURSIVE);
      if( pNew->mutex==0 ){
        rc = SQLITE_NOMEM;
      }else{
        rc = sqlite3_vfs_register(&pNew->base, 0);
      }
    }

    if( rc!=SQLITE_OK ){
      sqlite3_mutex_free(pNew->mutex);
      sqlite3_free(pNew);
    }
  }

  return rc;
}